

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall FfsParser::parseDepexSectionBody(FfsParser *this,UModelIndex *index)

{
  char cVar1;
  TreeModel *this_00;
  _Alloc_hider _Var2;
  CBString *this_01;
  USTATUS UVar3;
  CBString parsed;
  UByteArray body;
  CBString local_d0;
  FfsParser *local_b8;
  CBString local_b0;
  CBString local_98;
  CBString local_80;
  UByteArray local_68;
  EFI_GUID local_48;
  
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  local_b8 = this;
  TreeModel::body(&local_68,this->model,index);
  Bstrlib::CBString::CBString(&local_b0);
  _Var2._M_p = local_68.d._M_dataplus._M_p;
  if ((int)local_68.d._M_string_length < 2) {
    usprintf(&local_d0,"%s: DEPEX section too short","parseDepexSectionBody");
    msg(local_b8,&local_d0,index);
    Bstrlib::CBString::~CBString(&local_d0);
    UVar3 = 0x1c;
    goto LAB_00134dc1;
  }
  cVar1 = *local_68.d._M_dataplus._M_p;
  if (cVar1 == '\0') {
    if ((int)local_68.d._M_string_length != 0x12) {
      usprintf(&local_d0,"%s: DEPEX section too long for a section starting with BEFORE opcode",
               "parseDepexSectionBody");
      msg(local_b8,&local_d0,index);
LAB_00134b2a:
      this_01 = &local_d0;
      goto LAB_00134db9;
    }
    Bstrlib::CBString::CBString(&local_98,"\nBEFORE ");
    local_48._0_8_ = *(undefined8 *)(_Var2._M_p + 1);
    local_48.Data4 = *(UINT8 (*) [8])(_Var2._M_p + 9);
    guidToUString(&local_80,&local_48,true);
    Bstrlib::CBString::operator+(&local_d0,&local_98,&local_80);
    Bstrlib::CBString::operator+=(&local_b0,&local_d0);
    Bstrlib::CBString::~CBString(&local_d0);
    Bstrlib::CBString::~CBString(&local_80);
    Bstrlib::CBString::~CBString(&local_98);
    if (_Var2._M_p[0x11] != '\b') {
      usprintf(&local_d0,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
      msg(local_b8,&local_d0,index);
      goto LAB_00134b2a;
    }
  }
  else {
    if (cVar1 == '\x01') {
      if ((int)local_68.d._M_string_length == 0x12) {
        Bstrlib::CBString::CBString(&local_98,"\nAFTER ");
        local_48._0_8_ = *(undefined8 *)(_Var2._M_p + 1);
        local_48.Data4 = *(UINT8 (*) [8])(_Var2._M_p + 9);
        guidToUString(&local_80,&local_48,true);
        Bstrlib::CBString::operator+(&local_d0,&local_98,&local_80);
        Bstrlib::CBString::operator+=(&local_b0,&local_d0);
        Bstrlib::CBString::~CBString(&local_d0);
        Bstrlib::CBString::~CBString(&local_80);
        Bstrlib::CBString::~CBString(&local_98);
        if (_Var2._M_p[0x11] == '\b') goto LAB_00134dbe;
        usprintf(&local_d0,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
      }
      else {
        usprintf(&local_d0,"%s: DEPEX section too long for a section starting with AFTER opcode",
                 "parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
      }
      goto LAB_00134b2a;
    }
    if (cVar1 == '\t') {
      if ((int)local_68.d._M_string_length == 2) {
        usprintf(&local_d0,"%s: DEPEX section too short for a section starting with SOR opcode",
                 "parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
        goto LAB_00134b2a;
      }
      Bstrlib::CBString::CBString(&local_d0,"\nSOR");
      Bstrlib::CBString::operator+=(&local_b0,&local_d0);
      Bstrlib::CBString::~CBString(&local_d0);
      _Var2._M_p = _Var2._M_p + 1;
    }
    if ((long)_Var2._M_p - (long)local_68.d._M_dataplus._M_p <
        (long)(int)local_68.d._M_string_length) {
      do {
        switch(*_Var2._M_p) {
        case '\0':
          usprintf(&local_d0,"%s: misplaced BEFORE opcode","parseDepexSectionBody");
          msg(local_b8,&local_d0,index);
          goto LAB_00134b2a;
        case '\x01':
          usprintf(&local_d0,"%s: misplaced AFTER opcode","parseDepexSectionBody");
          msg(local_b8,&local_d0,index);
          goto LAB_00134b2a;
        case '\x02':
          if (0x11 < (uint)(((int)local_68.d._M_dataplus._M_p - (int)_Var2._M_p) +
                           (int)local_68.d._M_string_length)) {
            Bstrlib::CBString::CBString(&local_98,"\nPUSH ");
            local_48._0_8_ = *(undefined8 *)(_Var2._M_p + 1);
            local_48.Data4 = *(UINT8 (*) [8])(_Var2._M_p + 9);
            guidToUString(&local_80,&local_48,true);
            Bstrlib::CBString::operator+(&local_d0,&local_98,&local_80);
            Bstrlib::CBString::operator+=(&local_b0,&local_d0);
            Bstrlib::CBString::~CBString(&local_d0);
            Bstrlib::CBString::~CBString(&local_80);
            Bstrlib::CBString::~CBString(&local_98);
            _Var2._M_p = _Var2._M_p + 0x11;
            goto LAB_00134ccb;
          }
          Bstrlib::CBString::operator=(&local_b0,anon_var_dwarf_3510d + 0x10);
          usprintf(&local_d0,"%s: remains of DEPEX section too short for PUSH opcode",
                   "parseDepexSectionBody");
          msg(local_b8,&local_d0,index);
          goto LAB_00134b2a;
        case '\x03':
          Bstrlib::CBString::CBString(&local_d0,"\nAND");
          Bstrlib::CBString::operator+=(&local_b0,&local_d0);
          break;
        case '\x04':
          Bstrlib::CBString::CBString(&local_d0,"\nOR");
          Bstrlib::CBString::operator+=(&local_b0,&local_d0);
          break;
        case '\x05':
          Bstrlib::CBString::CBString(&local_d0,"\nNOT");
          Bstrlib::CBString::operator+=(&local_b0,&local_d0);
          break;
        case '\x06':
          Bstrlib::CBString::CBString(&local_d0,"\nTRUE");
          Bstrlib::CBString::operator+=(&local_b0,&local_d0);
          break;
        case '\a':
          Bstrlib::CBString::CBString(&local_d0,"\nFALSE");
          Bstrlib::CBString::operator+=(&local_b0,&local_d0);
          break;
        case '\b':
          Bstrlib::CBString::CBString(&local_d0,"\nEND");
          Bstrlib::CBString::operator+=(&local_b0,&local_d0);
          Bstrlib::CBString::~CBString(&local_d0);
          _Var2._M_p = _Var2._M_p + 1;
          if ((long)_Var2._M_p - (long)local_68.d._M_dataplus._M_p <
              (long)(int)local_68.d._M_string_length) {
            Bstrlib::CBString::operator=(&local_b0,anon_var_dwarf_3510d + 0x10);
            usprintf(&local_d0,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody")
            ;
            msg(local_b8,&local_d0,index);
            Bstrlib::CBString::~CBString(&local_d0);
          }
          goto LAB_00134ccb;
        case '\t':
          usprintf(&local_d0,"%s: misplaced SOR opcode","parseDepexSectionBody");
          msg(local_b8,&local_d0,index);
          goto LAB_00134b2a;
        default:
          usprintf(&local_d0,"%s: unknown opcode %02Xh","parseDepexSectionBody");
          msg(local_b8,&local_d0,index);
          goto LAB_00134b2a;
        }
        Bstrlib::CBString::~CBString(&local_d0);
        _Var2._M_p = _Var2._M_p + 1;
LAB_00134ccb:
      } while ((long)_Var2._M_p - (long)local_68.d._M_dataplus._M_p <
               (long)(int)local_68.d._M_string_length);
    }
    this_00 = local_b8->model;
    Bstrlib::CBString::CBString(&local_98,"\nParsed expression:");
    Bstrlib::CBString::operator+(&local_d0,&local_98,&local_b0);
    TreeModel::addInfo(this_00,index,&local_d0,true);
    Bstrlib::CBString::~CBString(&local_d0);
    this_01 = &local_98;
LAB_00134db9:
    Bstrlib::CBString::~CBString(this_01);
  }
LAB_00134dbe:
  UVar3 = 0;
LAB_00134dc1:
  Bstrlib::CBString::~CBString(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.d._M_dataplus._M_p != &local_68.d.field_2) {
    operator_delete(local_68.d._M_dataplus._M_p);
  }
  return UVar3;
}

Assistant:

USTATUS FfsParser::parseDepexSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    UByteArray body = model->body(index);
    UString parsed;
    
    // Check data to be present
    if (body.size() < 2) { // 2 is a minimal sane value, i.e TRUE + END
        msg(usprintf("%s: DEPEX section too short", __FUNCTION__), index);
        return U_DEPEX_PARSE_FAILED;
    }
    
    const EFI_GUID * guid;
    const UINT8* current = (const UINT8*)body.constData();
    
    // Special cases of first opcode
    switch (*current) {
        case EFI_DEP_BEFORE:
            if (body.size() != 2 * EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)) {
                msg(usprintf("%s: DEPEX section too long for a section starting with BEFORE opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
            parsed += UString("\nBEFORE ") + guidToUString(readUnaligned(guid));
            current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
            if (*current != EFI_DEP_END){
                msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            // No further parsing required
            return U_SUCCESS;
        case EFI_DEP_AFTER:
            if (body.size() != 2 * EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)){
                msg(usprintf("%s: DEPEX section too long for a section starting with AFTER opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
            parsed += UString("\nAFTER ") + guidToUString(readUnaligned(guid));
            current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
            if (*current != EFI_DEP_END) {
                msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            // No further parsing required
            return U_SUCCESS;
        case EFI_DEP_SOR:
            if (body.size() <= 2 * EFI_DEP_OPCODE_SIZE) {
                msg(usprintf("%s: DEPEX section too short for a section starting with SOR opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            parsed += UString("\nSOR");
            current += EFI_DEP_OPCODE_SIZE;
            break;
    }
    
    // Parse the rest of depex
    while (current - (const UINT8*)body.constData() < body.size()) {
        switch (*current) {
            case EFI_DEP_BEFORE: {
                msg(usprintf("%s: misplaced BEFORE opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_AFTER: {
                msg(usprintf("%s: misplaced AFTER opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_SOR: {
                msg(usprintf("%s: misplaced SOR opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_PUSH:
                // Check that the rest of depex has correct size
                if ((UINT32)body.size() - (UINT32)(current - (const UINT8*)body.constData()) <= EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)) {
                    parsed.clear();
                    msg(usprintf("%s: remains of DEPEX section too short for PUSH opcode", __FUNCTION__), index);
                    return U_SUCCESS;
                }
                guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
                parsed += UString("\nPUSH ") + guidToUString(readUnaligned(guid));
                current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
                break;
            case EFI_DEP_AND:
                parsed += UString("\nAND");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_OR:
                parsed += UString("\nOR");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_NOT:
                parsed += UString("\nNOT");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_TRUE:
                parsed += UString("\nTRUE");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_FALSE:
                parsed += UString("\nFALSE");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_END:
                parsed += UString("\nEND");
                current += EFI_DEP_OPCODE_SIZE;
                // Check that END is the last opcode
                if (current - (const UINT8*)body.constData() < body.size()) {
                    parsed.clear();
                    msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                }
                break;
            default:
                msg(usprintf("%s: unknown opcode %02Xh", __FUNCTION__, *current), index);
                // No further parsing required
                return U_SUCCESS;
        }
    }
    
    // Add info
    model->addInfo(index, UString("\nParsed expression:") + parsed);
    
    return U_SUCCESS;
}